

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_7z.cpp
# Opt level: O0

void __thiscall F7ZFile::~F7ZFile(F7ZFile *this)

{
  F7ZLump *pFVar1;
  long lVar2;
  C7zArchive *this_00;
  F7ZLump *this_01;
  F7ZFile *this_local;
  
  (this->super_FResourceFile)._vptr_FResourceFile = (_func_int **)&PTR__F7ZFile_00b86d20;
  if ((this->Lumps != (F7ZLump *)0x0) && (pFVar1 = this->Lumps, pFVar1 != (F7ZLump *)0x0)) {
    lVar2 = *(long *)&pFVar1[-1].super_FResourceLump.Namespace;
    this_01 = pFVar1 + lVar2;
    while (pFVar1 != this_01) {
      this_01 = this_01 + -1;
      F7ZLump::~F7ZLump(this_01);
    }
    operator_delete__(&pFVar1[-1].super_FResourceLump.Namespace,lVar2 * 0x50 + 8);
  }
  if ((this->Archive != (C7zArchive *)0x0) &&
     (this_00 = this->Archive, this_00 != (C7zArchive *)0x0)) {
    C7zArchive::~C7zArchive(this_00);
    operator_delete(this_00,0x4140);
  }
  FResourceFile::~FResourceFile(&this->super_FResourceFile);
  return;
}

Assistant:

F7ZFile::~F7ZFile()
{
	if (Lumps != NULL)
	{
		delete[] Lumps;
	}
	if (Archive != NULL)
	{
		delete Archive;
	}
}